

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeCall(Ref target,Ref arg)

{
  Ref RVar1;
  Ref r;
  Value *pVVar2;
  undefined8 *puVar3;
  Value *local_28;
  Ref ret;
  
  RVar1 = makeRawArray(3);
  r = makeRawString((IString *)&CALL);
  pVVar2 = Value::push_back(RVar1.inst,r);
  pVVar2 = Value::push_back(pVVar2,target);
  RVar1 = makeRawArray(0);
  local_28 = Value::push_back(pVVar2,RVar1);
  puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
  Value::push_back((Value *)*puVar3,arg);
  return (Ref)local_28;
}

Assistant:

static Ref makeCall(Ref target, Ref arg) {
    Ref ret = &makeRawArray(3)
                 ->push_back(makeRawString(CALL))
                 .push_back(target)
                 .push_back(makeRawArray());
    ret[2]->push_back(arg);
    return ret;
  }